

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O0

bool __thiscall
flow::Runtime::verifyNativeCalls(Runtime *this,IRProgram *program,IRBuilder *builder)

{
  bool bVar1;
  uint uVar2;
  BoxedIterator siglen;
  element_type *this_00;
  element_type *this_01;
  IRBuiltinFunction *this_02;
  Signature *pSVar3;
  IRBuiltinHandler *this_03;
  reference ppVar4;
  uchar *in_R8;
  size_t in_R9;
  UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  UVar5;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  UVar6;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  UVar7;
  NativeCallback *local_1f0;
  NativeCallback *local_1d0;
  pair<flow::Instr_*,_flow::NativeCallback_*> *call;
  iterator __end1_1;
  iterator __begin1_1;
  list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  *__range1_1;
  NativeCallback *native_1;
  HandlerCallInstr *hi;
  NativeCallback *native;
  CallInstr *ci;
  Instr *instr;
  iterator __end3;
  iterator __begin3;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  *__range3;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  IRHandler *handler;
  iterator __end1;
  iterator __begin1;
  UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  local_58;
  UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  *local_48;
  UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  *__range1;
  list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  calls;
  IRBuilder *builder_local;
  IRProgram *program_local;
  Runtime *this_local;
  
  calls.
  super__List_base<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  ._M_impl._M_node._M_size = (size_t)builder;
  std::__cxx11::
  list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  ::list((list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
          *)&__range1);
  UVar5 = IRProgram::handlers(program);
  local_58.end_ = UVar5.end_.it_._M_current;
  siglen._M_current =
       (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
       UVar5.begin_.it_._M_current;
  local_48 = &local_58;
  local_58.begin_.it_._M_current = (BoxedIterator)(BoxedIterator)siglen._M_current;
  __end1 = util::
           UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
           ::begin(local_48);
  handler = (IRHandler *)
            util::
            UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
            ::end(local_48);
  while (bVar1 = util::
                 UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
                 ::iterator::operator!=(&__end1,(iterator *)&handler), bVar1) {
    this_00 = util::
              UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
              ::iterator::operator*(&__end1);
    UVar6 = IRHandler::basicBlocks_abi_cxx11_(this_00);
    siglen._M_current =
         (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
         UVar6.begin_.it_._M_node;
    __begin2.it_._M_node = (BoxedIterator)(BoxedIterator)siglen._M_current;
    __end2 = util::
             UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
             ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                      *)&__begin2);
    bb = (BasicBlock *)
         util::
         UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
         ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                *)&__begin2);
    while (bVar1 = util::
                   UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                   ::iterator::operator!=(&__end2,(iterator *)&bb), bVar1) {
      this_01 = util::
                UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                ::iterator::operator*(&__end2);
      UVar7 = BasicBlock::instructions(this_01);
      siglen._M_current =
           (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)
           UVar7.begin_.it_._M_current;
      __begin3.it_._M_current = (BoxedIterator)(BoxedIterator)siglen._M_current;
      __end3 = util::
               UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
               ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                        *)&__begin3);
      instr = (Instr *)util::
                       UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                       ::end((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                              *)&__begin3);
      while (bVar1 = util::
                     UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                     ::iterator::operator!=(&__end3,(iterator *)&instr), bVar1) {
        ci = (CallInstr *)
             util::
             UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::iterator::operator*(&__end3);
        if ((element_type *)ci == (element_type *)0x0) {
          local_1d0 = (NativeCallback *)0x0;
        }
        else {
          siglen._M_current =
               (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)0x0;
          local_1d0 = (NativeCallback *)__dynamic_cast(ci,&Instr::typeinfo,&CallInstr::typeinfo);
        }
        native = local_1d0;
        if (local_1d0 == (NativeCallback *)0x0) {
          if (ci == (CallInstr *)0x0) {
            local_1f0 = (NativeCallback *)0x0;
          }
          else {
            siglen._M_current =
                 (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)0x0;
            local_1f0 = (NativeCallback *)
                        __dynamic_cast(ci,&Instr::typeinfo,&HandlerCallInstr::typeinfo);
          }
          native_1 = local_1f0;
          if (local_1f0 != (NativeCallback *)0x0) {
            this_03 = HandlerCallInstr::callee((HandlerCallInstr *)local_1f0);
            pSVar3 = IRBuiltinHandler::signature(this_03);
            __range1_1 = (list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
                          *)find(this,pSVar3);
            if ((NativeCallback *)__range1_1 != (NativeCallback *)0x0) {
              std::__cxx11::
              list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
              ::emplace_back<flow::Instr*&,flow::NativeCallback*&>
                        ((list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
                          *)&__range1,(Instr **)&ci,(NativeCallback **)&__range1_1);
            }
          }
        }
        else {
          this_02 = CallInstr::callee((CallInstr *)local_1d0);
          pSVar3 = IRBuiltinFunction::signature(this_02);
          hi = (HandlerCallInstr *)find(this,pSVar3);
          if ((NativeCallback *)hi != (NativeCallback *)0x0) {
            std::__cxx11::
            list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
            ::emplace_back<flow::Instr*&,flow::NativeCallback*&>
                      ((list<std::pair<flow::Instr*,flow::NativeCallback*>,std::allocator<std::pair<flow::Instr*,flow::NativeCallback*>>>
                        *)&__range1,(Instr **)&ci,(NativeCallback **)&hi);
          }
        }
        util::
        UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
        ::iterator::operator++(&__end3);
      }
      util::
      UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
      ::iterator::operator++(&__end2);
    }
    util::
    UnboxedRange<std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
    ::iterator::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::
             list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
             ::begin((list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
                      *)&__range1);
  call = (pair<flow::Instr_*,_flow::NativeCallback_*> *)
         std::__cxx11::
         list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
         ::end((list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
                *)&__range1);
  do {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&call);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_00212a26:
      std::__cxx11::
      list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
      ::~list((list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
               *)&__range1);
      return this_local._7_1_;
    }
    ppVar4 = std::_List_iterator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>::operator*
                       (&__end1_1);
    uVar2 = NativeCallback::verify
                      (ppVar4->second,(EVP_PKEY_CTX *)ppVar4->first,
                       (uchar *)calls.
                                super__List_base<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
                                ._M_impl._M_node._M_size,(size_t)siglen._M_current,in_R8,in_R9);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_00212a26;
    }
    std::_List_iterator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool Runtime::verifyNativeCalls(IRProgram* program, IRBuilder* builder) {
  std::list<std::pair<Instr*, NativeCallback*>> calls;

  for (IRHandler* handler : program->handlers()) {
    for (BasicBlock* bb : handler->basicBlocks()) {
      for (Instr* instr : bb->instructions()) {
        if (auto ci = dynamic_cast<CallInstr*>(instr)) {
          if (auto native = find(ci->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        } else if (auto hi = dynamic_cast<HandlerCallInstr*>(instr)) {
          if (auto native = find(hi->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        }
      }
    }
  }

  for (const std::pair<Instr*, NativeCallback*>& call : calls) {
    if (!call.second->verify(call.first, builder)) {
      return false;
    }
  }

  return true;
}